

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cc
# Opt level: O0

void __thiscall serial::Serial::setPort(Serial *this,string *port)

{
  bool bVar1;
  int __oflag;
  int __fd;
  bool was_open;
  ScopedWriteLock local_28;
  ScopedWriteLock wlock;
  ScopedReadLock rlock;
  string *port_local;
  Serial *this_local;
  SerialImpl *pimpl;
  
  ScopedReadLock::ScopedReadLock((ScopedReadLock *)&wlock,this->pimpl_);
  pimpl = this->pimpl_;
  ScopedWriteLock::ScopedWriteLock(&local_28,pimpl);
  __fd = (int)pimpl;
  bVar1 = SerialImpl::isOpen(this->pimpl_);
  if (bVar1) {
    close(this,__fd);
  }
  SerialImpl::setPort(this->pimpl_,port);
  if (bVar1) {
    open(this,(char *)port,__oflag);
  }
  ScopedWriteLock::~ScopedWriteLock(&local_28);
  ScopedReadLock::~ScopedReadLock((ScopedReadLock *)&wlock);
  return;
}

Assistant:

void
Serial::setPort (const string &port)
{
  ScopedReadLock rlock(this->pimpl_);
  ScopedWriteLock wlock(this->pimpl_);
  bool was_open = pimpl_->isOpen ();
  if (was_open) close();
  pimpl_->setPort (port);
  if (was_open) open ();
}